

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O2

void Rml::Context::SendEvents
               (ElementSet *old_items,ElementSet *new_items,EventId id,Dictionary *parameters)

{
  Element *this;
  pointer pOVar1;
  ElementObserverList *__range1;
  ObserverPtr<Rml::Element> *element;
  pointer pOVar2;
  ElementObserverList elements;
  vector<Rml::ObserverPtr<Rml::Element>,_std::allocator<Rml::ObserverPtr<Rml::Element>_>_> local_38;
  
  local_38.
  super__Vector_base<Rml::ObserverPtr<Rml::Element>,_std::allocator<Rml::ObserverPtr<Rml::Element>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<Rml::ObserverPtr<Rml::Element>,_std::allocator<Rml::ObserverPtr<Rml::Element>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<Rml::ObserverPtr<Rml::Element>,_std::allocator<Rml::ObserverPtr<Rml::Element>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::
  __set_difference<__gnu_cxx::__normal_iterator<Rml::Element*const*,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>,__gnu_cxx::__normal_iterator<Rml::Element*const*,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>,Rml::ElementObserverListBackInserter,__gnu_cxx::__ops::_Iter_less_iter>
            ((old_items->m_container).
             super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (old_items->m_container).
             super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (new_items->m_container).
             super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (new_items->m_container).
             super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  pOVar1 = local_38.
           super__Vector_base<Rml::ObserverPtr<Rml::Element>,_std::allocator<Rml::ObserverPtr<Rml::Element>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pOVar2 = local_38.
                super__Vector_base<Rml::ObserverPtr<Rml::Element>,_std::allocator<Rml::ObserverPtr<Rml::Element>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pOVar2 != pOVar1; pOVar2 = pOVar2 + 1) {
    if ((pOVar2->block != (ObserverPtrBlock *)0x0) &&
       (this = (Element *)pOVar2->block->pointed_to_object, this != (Element *)0x0)) {
      Element::DispatchEvent(this,id,parameters);
    }
  }
  ::std::vector<Rml::ObserverPtr<Rml::Element>,_std::allocator<Rml::ObserverPtr<Rml::Element>_>_>::
  ~vector(&local_38);
  return;
}

Assistant:

void Context::SendEvents(const ElementSet& old_items, const ElementSet& new_items, EventId id, const Dictionary& parameters)
{
	// We put our elements in observer pointers in case some of them are deleted during dispatch.
	ElementObserverList elements;
	std::set_difference(old_items.begin(), old_items.end(), new_items.begin(), new_items.end(), ElementObserverListBackInserter(elements));
	for (auto& element : elements)
	{
		if (element)
			element->DispatchEvent(id, parameters);
	}
}